

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

void store_winner_mode_stats
               (AV1_COMMON *cm,MACROBLOCK *x,MB_MODE_INFO *mbmi,RD_STATS *rd_cost,
               RD_STATS *rd_cost_y,RD_STATS *rd_cost_uv,THR_MODES mode_index,uint8_t *color_map,
               BLOCK_SIZE bsize,int64_t this_rd,int multi_winner_mode_type,int txfm_search_done)

{
  int iVar1;
  void *in_RCX;
  void *in_RDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int *in_R8;
  undefined4 *in_R9;
  byte in_stack_00000008;
  void *in_stack_00000010;
  BLOCK_SIZE in_stack_00000018;
  long in_stack_00000020;
  int block_height;
  int block_width;
  MACROBLOCKD *xd_1;
  int skip_txfm;
  int is_intra_mode;
  int skip_ctx;
  MACROBLOCKD *xd;
  int max_winner_mode_count;
  int is_palette_mode;
  int mode_idx;
  WinnerModeStats *winner_mode_stats;
  int local_88;
  bool local_72;
  byte local_71;
  int local_70;
  int local_6c;
  MACROBLOCKD *local_68;
  uint local_5c;
  uint local_58;
  int local_54;
  MACROBLOCKD *local_50;
  int local_44;
  uint local_40;
  int local_3c;
  long local_38;
  undefined4 *local_30;
  int *local_28;
  void *local_20;
  void *local_18;
  long local_10;
  AV1_COMMON *local_8;
  
  local_38 = *(long *)(in_RSI + 0x1c630);
  local_3c = 0;
  local_40 = (uint)(*(char *)((long)in_RDX + 0x8e) != '\0');
  if (((block_height != 0) && (in_stack_00000020 != 0x7fffffffffffffff)) &&
     ((local_30 = in_R9, local_28 = in_R8, local_20 = in_RCX, local_18 = in_RDX, local_10 = in_RSI,
      local_8 = in_RDI, iVar1 = frame_is_intra_only(in_RDI), iVar1 != 0 || (local_40 == 0)))) {
    local_44 = winner_mode_count_allowed[block_height];
    if (*(int *)(local_10 + 0x1c638) != 0) {
      local_3c = 0;
      while ((local_3c < *(int *)(local_10 + 0x1c638) &&
             (*(long *)(local_38 + (long)local_3c * 0x40f0 + 0xd8) <= in_stack_00000020))) {
        local_3c = local_3c + 1;
      }
      if (local_3c == local_44) {
        return;
      }
      if (local_3c < local_44 + -1) {
        memmove((void *)(local_38 + (long)(local_3c + 1) * 0x40f0),
                (void *)(local_38 + (long)local_3c * 0x40f0),
                (long)((local_44 - local_3c) + -1) * 0x40f0);
      }
    }
    memcpy((void *)(local_38 + (long)local_3c * 0x40f0),local_18,0xb0);
    *(long *)(local_38 + (long)local_3c * 0x40f0 + 0xd8) = in_stack_00000020;
    *(byte *)(local_38 + (long)local_3c * 0x40f0 + 0x40e8) = in_stack_00000008;
    iVar1 = frame_is_intra_only(local_8);
    if ((((iVar1 == 0) && (local_20 != (void *)0x0)) && (local_28 != (int *)0x0)) &&
       (local_30 != (undefined4 *)0x0)) {
      local_50 = (MACROBLOCKD *)(local_10 + 0x1a0);
      local_54 = av1_get_skip_txfm_context(local_50);
      local_58 = (uint)(av1_mode_defs[in_stack_00000008].mode < 0xd);
      local_71 = 0;
      if (*(char *)((long)local_18 + 0x90) != '\0') {
        local_71 = local_58 != 0 ^ 0xff;
      }
      local_5c = (uint)(local_71 & 1);
      memcpy((void *)(local_38 + (long)local_3c * 0x40f0 + 0xb0),local_20,0x28);
      if ((int)xd_1 != 0) {
        local_72 = *(char *)((long)local_20 + 0x20) != '\0' || local_5c != 0;
        *(int *)(local_38 + (long)local_3c * 0x40f0 + 0xe0) =
             *local_28 +
             *(int *)(local_10 + 0x8c80 + (long)local_54 * 8 + (long)(int)(uint)local_72 * 4);
        *(undefined4 *)(local_38 + (long)local_3c * 0x40f0 + 0xe4) = *local_30;
      }
    }
    if (in_stack_00000010 != (void *)0x0) {
      local_68 = (MACROBLOCKD *)(local_10 + 0x1a0);
      av1_get_block_dimensions
                (in_stack_00000018,0,local_68,&local_6c,&local_70,(int *)0x0,(int *)0x0);
      memcpy((void *)(local_38 + (long)local_3c * 0x40f0 + 0xe8),in_stack_00000010,
             (long)(local_6c * local_70));
    }
    if (*(int *)(local_10 + 0x1c638) + 1 < local_44) {
      local_88 = *(int *)(local_10 + 0x1c638) + 1;
    }
    else {
      local_88 = local_44;
    }
    *(int *)(local_10 + 0x1c638) = local_88;
  }
  return;
}

Assistant:

static inline void store_winner_mode_stats(
    const AV1_COMMON *const cm, MACROBLOCK *x, const MB_MODE_INFO *mbmi,
    RD_STATS *rd_cost, RD_STATS *rd_cost_y, RD_STATS *rd_cost_uv,
    THR_MODES mode_index, uint8_t *color_map, BLOCK_SIZE bsize, int64_t this_rd,
    int multi_winner_mode_type, int txfm_search_done) {
  WinnerModeStats *winner_mode_stats = x->winner_mode_stats;
  int mode_idx = 0;
  int is_palette_mode = mbmi->palette_mode_info.palette_size[PLANE_TYPE_Y] > 0;
  // Mode stat is not required when multiwinner mode processing is disabled
  if (multi_winner_mode_type == MULTI_WINNER_MODE_OFF) return;
  // Ignore mode with maximum rd
  if (this_rd == INT64_MAX) return;
  // TODO(any): Winner mode processing is currently not applicable for palette
  // mode in Inter frames. Clean-up the following code, once support is added
  if (!frame_is_intra_only(cm) && is_palette_mode) return;

  int max_winner_mode_count = winner_mode_count_allowed[multi_winner_mode_type];
  assert(x->winner_mode_count >= 0 &&
         x->winner_mode_count <= max_winner_mode_count);

  if (x->winner_mode_count) {
    // Find the mode which has higher rd cost than this_rd
    for (mode_idx = 0; mode_idx < x->winner_mode_count; mode_idx++)
      if (winner_mode_stats[mode_idx].rd > this_rd) break;

    if (mode_idx == max_winner_mode_count) {
      // No mode has higher rd cost than this_rd
      return;
    } else if (mode_idx < max_winner_mode_count - 1) {
      // Create a slot for current mode and move others to the next slot
      memmove(
          &winner_mode_stats[mode_idx + 1], &winner_mode_stats[mode_idx],
          (max_winner_mode_count - mode_idx - 1) * sizeof(*winner_mode_stats));
    }
  }
  // Add a mode stat for winner mode processing
  winner_mode_stats[mode_idx].mbmi = *mbmi;
  winner_mode_stats[mode_idx].rd = this_rd;
  winner_mode_stats[mode_idx].mode_index = mode_index;

  // Update rd stats required for inter frame
  if (!frame_is_intra_only(cm) && rd_cost && rd_cost_y && rd_cost_uv) {
    const MACROBLOCKD *xd = &x->e_mbd;
    const int skip_ctx = av1_get_skip_txfm_context(xd);
    const int is_intra_mode = av1_mode_defs[mode_index].mode < INTRA_MODE_END;
    const int skip_txfm = mbmi->skip_txfm && !is_intra_mode;

    winner_mode_stats[mode_idx].rd_cost = *rd_cost;
    if (txfm_search_done) {
      winner_mode_stats[mode_idx].rate_y =
          rd_cost_y->rate +
          x->mode_costs
              .skip_txfm_cost[skip_ctx][rd_cost->skip_txfm || skip_txfm];
      winner_mode_stats[mode_idx].rate_uv = rd_cost_uv->rate;
    }
  }

  if (color_map) {
    // Store color_index_map for palette mode
    const MACROBLOCKD *const xd = &x->e_mbd;
    int block_width, block_height;
    av1_get_block_dimensions(bsize, AOM_PLANE_Y, xd, &block_width,
                             &block_height, NULL, NULL);
    memcpy(winner_mode_stats[mode_idx].color_index_map, color_map,
           block_width * block_height * sizeof(color_map[0]));
  }

  x->winner_mode_count =
      AOMMIN(x->winner_mode_count + 1, max_winner_mode_count);
}